

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_NewScFltArray(InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  AuxArray<double> *doubles;
  JavascriptArray *this_00;
  
  doubles = ByteCodeReader::ReadAuxArray<double>
                      ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  this_00 = (JavascriptArray *)
            JavascriptLibrary::CreateNativeFloatArrayLiteral
                      (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),doubles->count);
  JavascriptOperators::AddFloatsToArraySegment
            ((SparseArraySegment<double> *)(this_00->head).ptr,doubles);
  JavascriptArray::CheckForceES5Array(this_00);
  SetReg<unsigned_int>(this,playout->R0,this_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScFltArray(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::AuxArray<double> *doubles = Js::ByteCodeReader::ReadAuxArray<double>(playout->Offset, this->GetFunctionBody());

        JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(doubles->count);

        SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();

        JavascriptOperators::AddFloatsToArraySegment(segment, doubles);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }